

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_cfg.cpp
# Opt level: O3

void __thiscall MppEncCfgService::MppEncCfgService(MppEncCfgService *this)

{
  MPP_RET MVar1;
  RK_S32 RVar2;
  MppCfgInfo tmp;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 local_38;
  
  this->mTrie = (MppTrie)0x0;
  mpp_env_get_u32("mpp_enc_cfg_debug",&mpp_enc_cfg_debug,0);
  MVar1 = mpp_trie_init(&this->mTrie,"MppEncCfg");
  if (MVar1 != MPP_OK) {
    _mpp_log_l(2,"mpp_enc_cfg","failed to init enc cfg set trie ret %d\n","MppEncCfgService",
               (ulong)(uint)MVar1);
    return;
  }
  local_48 = 0;
  uStack_40 = 0x400000001;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"base:low_delay",&local_48,0x14);
  local_48 = 0x9000000000;
  uStack_40 = 0x9400000001;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"rc:mode",&local_48,0x14);
  local_48 = 0x9000000000;
  uStack_40 = 0x9c00000004;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"rc:bps_target",&local_48,0x14);
  local_48 = 0x9000000000;
  uStack_40 = 0xa000000004;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"rc:bps_max",&local_48,0x14);
  local_48 = 0x9000000000;
  uStack_40 = 0xa400000004;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"rc:bps_min",&local_48,0x14);
  local_48 = 0x9000000000;
  uStack_40 = 0xa800000020;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"rc:fps_in_flex",&local_48,0x14);
  local_48 = 0x9000000000;
  uStack_40 = 0xac00000020;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"rc:fps_in_num",&local_48,0x14);
  local_48 = 0x9000000000;
  uStack_40 = 0xb000000020;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"rc:fps_in_denom",&local_48,0x14);
  local_48 = 0x9000000000;
  uStack_40 = 0xb000000020;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"rc:fps_in_denorm",&local_48,0x14);
  local_48 = 0x9000000000;
  uStack_40 = 0xb400000040;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"rc:fps_out_flex",&local_48,0x14);
  local_48 = 0x9000000000;
  uStack_40 = 0xb800000040;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"rc:fps_out_num",&local_48,0x14);
  local_48 = 0x9000000000;
  uStack_40 = 0xbc00000040;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"rc:fps_out_denom",&local_48,0x14);
  local_48 = 0x9000000000;
  uStack_40 = 0xbc00000040;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"rc:fps_out_denorm",&local_48,0x14);
  local_48 = 0x9000000000;
  uStack_40 = 0xc000000040;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"rc:fps_chg_no_idr",&local_48,0x14);
  local_48 = 0x9000000000;
  uStack_40 = 0xc400000080;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"rc:gop",&local_48,0x14);
  local_48 = 0x9000000005;
  uStack_40 = 0xc810000000;
  local_38 = 8;
  mpp_trie_add_info(this->mTrie,"rc:ref_cfg",&local_48,0x14);
  local_48 = 0x9000000001;
  uStack_40 = 0xd400000200;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"rc:max_reenc_times",&local_48,0x14);
  local_48 = 0x9000000001;
  uStack_40 = 0xf400004000;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"rc:priority",&local_48,0x14);
  local_48 = 0x9000000001;
  uStack_40 = 0xdc00000400;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"rc:drop_mode",&local_48,0x14);
  local_48 = 0x9000000001;
  uStack_40 = 0xe000000400;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"rc:drop_thd",&local_48,0x14);
  local_48 = 0x9000000001;
  uStack_40 = 0xe400000400;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"rc:drop_gap",&local_48,0x14);
  local_48 = 0x9000000000;
  uStack_40 = 0x10000000800;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"rc:max_i_prop",&local_48,0x14);
  local_48 = 0x9000000000;
  uStack_40 = 0x10400001000;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"rc:min_i_prop",&local_48,0x14);
  local_48 = 0x9000000000;
  uStack_40 = 0x10800002000;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"rc:init_ip_ratio",&local_48,0x14);
  local_48 = 0x9000000001;
  uStack_40 = 0xe800008000;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"rc:super_mode",&local_48,0x14);
  local_48 = 0x9000000001;
  uStack_40 = 0xec00008000;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"rc:super_i_thd",&local_48,0x14);
  local_48 = 0x9000000001;
  uStack_40 = 0xf000008000;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"rc:super_p_thd",&local_48,0x14);
  local_48 = 0x9000000001;
  uStack_40 = 0xf801000000;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"rc:debreath_en",&local_48,0x14);
  local_48 = 0x9000000001;
  uStack_40 = 0xfc01000000;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"rc:debreath_strength",&local_48,0x14);
  local_48 = 0x9000000000;
  uStack_40 = 0x10c00010000;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"rc:qp_init",&local_48,0x14);
  local_48 = 0x9000000000;
  uStack_40 = 0x11800020000;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"rc:qp_min",&local_48,0x14);
  local_48 = 0x9000000000;
  uStack_40 = 0x11000020000;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"rc:qp_max",&local_48,0x14);
  local_48 = 0x9000000000;
  uStack_40 = 0x11c00040000;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"rc:qp_min_i",&local_48,0x14);
  local_48 = 0x9000000000;
  uStack_40 = 0x11400040000;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"rc:qp_max_i",&local_48,0x14);
  local_48 = 0x9000000000;
  uStack_40 = 0x12000080000;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"rc:qp_step",&local_48,0x14);
  local_48 = 0x9000000000;
  uStack_40 = 0x12400100000;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"rc:qp_ip",&local_48,0x14);
  local_48 = 0x9000000000;
  uStack_40 = 0x12800200000;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"rc:qp_vi",&local_48,0x14);
  local_48 = 0x9000000000;
  uStack_40 = 0x14002000000;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"rc:hier_qp_en",&local_48,0x14);
  local_48 = 0x9000000004;
  uStack_40 = 0x14402000000;
  local_38 = 0x10;
  mpp_trie_add_info(this->mTrie,"rc:hier_qp_delta",&local_48,0x14);
  local_48 = 0x9000000004;
  uStack_40 = 0x15402000000;
  local_38 = 0x10;
  mpp_trie_add_info(this->mTrie,"rc:hier_frame_num",&local_48,0x14);
  local_48 = 0x9000000000;
  uStack_40 = 0xd804000000;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"rc:stats_time",&local_48,0x14);
  local_48 = 0x9000000001;
  uStack_40 = 0x16408000000;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"rc:refresh_en",&local_48,0x14);
  local_48 = 0x9000000001;
  uStack_40 = 0x16808000000;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"rc:refresh_mode",&local_48,0x14);
  local_48 = 0x9000000001;
  uStack_40 = 0x16c08000000;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"rc:refresh_num",&local_48,0x14);
  local_48 = 0x9000000000;
  uStack_40 = 0x12c20000000;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"rc:fqp_min_i",&local_48,0x14);
  local_48 = 0x9000000000;
  uStack_40 = 0x13020000000;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"rc:fqp_min_p",&local_48,0x14);
  local_48 = 0x9000000000;
  uStack_40 = 0x13420000000;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"rc:fqp_max_i",&local_48,0x14);
  local_48 = 0x9000000000;
  uStack_40 = 0x13820000000;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"rc:fqp_max_p",&local_48,0x14);
  local_48 = 0x9000000000;
  uStack_40 = 0x13c20000000;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"rc:mt_st_swth_frm_qp",&local_48,0x14);
  local_48 = 0x800000000;
  uStack_40 = 0xc00000001;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"prep:width",&local_48,0x14);
  local_48 = 0x800000000;
  uStack_40 = 0x1000000001;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"prep:height",&local_48,0x14);
  local_48 = 0x800000000;
  uStack_40 = 0x1c00000001;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"prep:max_width",&local_48,0x14);
  local_48 = 0x800000000;
  uStack_40 = 0x2000000001;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"prep:max_height",&local_48,0x14);
  local_48 = 0x800000000;
  uStack_40 = 0x1400000001;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"prep:hor_stride",&local_48,0x14);
  local_48 = 0x800000000;
  uStack_40 = 0x1800000001;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"prep:ver_stride",&local_48,0x14);
  local_48 = 0x800000000;
  uStack_40 = 0x2400000004;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"prep:format",&local_48,0x14);
  local_48 = 0x800000000;
  uStack_40 = 0x3800000004;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"prep:format_out",&local_48,0x14);
  local_48 = 0x800000000;
  uStack_40 = 0x3c00000004;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"prep:chroma_ds_mode",&local_48,0x14);
  local_48 = 0x800000000;
  uStack_40 = 0x4400000004;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"prep:fix_chroma_en",&local_48,0x14);
  local_48 = 0x800000000;
  uStack_40 = 0x4800000004;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"prep:fix_chroma_u",&local_48,0x14);
  local_48 = 0x800000000;
  uStack_40 = 0x4c00000004;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"prep:fix_chroma_v",&local_48,0x14);
  local_48 = 0x800000000;
  uStack_40 = 0x2800020000;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"prep:colorspace",&local_48,0x14);
  local_48 = 0x800000000;
  uStack_40 = 0x2c00040000;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"prep:colorprim",&local_48,0x14);
  local_48 = 0x800000000;
  uStack_40 = 0x3000080000;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"prep:colortrc",&local_48,0x14);
  local_48 = 0x800000000;
  uStack_40 = 0x3400010000;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"prep:colorrange",&local_48,0x14);
  local_48 = 0x800000000;
  uStack_40 = 0x3400010000;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"prep:range",&local_48,0x14);
  local_48 = 0x800000000;
  uStack_40 = 0x4000010000;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"prep:range_out",&local_48,0x14);
  local_48 = 0x800000000;
  uStack_40 = 0x5400000010;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"prep:rotation",&local_48,0x14);
  local_48 = 0x800000000;
  uStack_40 = 0x5c00000020;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"prep:mirroring",&local_48,0x14);
  local_48 = 0x800000000;
  uStack_40 = 0x6000000040;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"prep:flip",&local_48,0x14);
  local_48 = 0x34800000000;
  uStack_40 = 0x34000000000;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"codec:type",&local_48,0x14);
  local_48 = 0x34800000000;
  uStack_40 = 0x34c00000001;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"h264:stream_type",&local_48,0x14);
  local_48 = 0x34800000000;
  uStack_40 = 0x36c00000002;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"h264:profile",&local_48,0x14);
  local_48 = 0x34800000000;
  uStack_40 = 0x37000000002;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"h264:level",&local_48,0x14);
  local_48 = 0x34800000001;
  uStack_40 = 0x35000000400;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"h264:poc_type",&local_48,0x14);
  local_48 = 0x34800000001;
  uStack_40 = 0x35400000800;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"h264:log2_max_poc_lsb",&local_48,0x14);
  local_48 = 0x34800000001;
  uStack_40 = 0x35800001000;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"h264:log2_max_frm_num",&local_48,0x14);
  local_48 = 0x34800000001;
  uStack_40 = 0x35c00002000;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"h264:gaps_not_allowed",&local_48,0x14);
  local_48 = 0x34800000000;
  uStack_40 = 0x37800000004;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"h264:cabac_en",&local_48,0x14);
  local_48 = 0x34800000000;
  uStack_40 = 0x38000000004;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"h264:cabac_idc",&local_48,0x14);
  local_48 = 0x34800000000;
  uStack_40 = 0x38800000010;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"h264:trans8x8",&local_48,0x14);
  local_48 = 0x34800000000;
  uStack_40 = 0x38c00000020;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"h264:const_intra",&local_48,0x14);
  local_48 = 0x34800000000;
  uStack_40 = 0x39000000200;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"h264:scaling_list",&local_48,0x14);
  local_48 = 0x34800000000;
  uStack_40 = 0x39400000040;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"h264:cb_qp_offset",&local_48,0x14);
  local_48 = 0x34800000000;
  uStack_40 = 0x39800000040;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"h264:cr_qp_offset",&local_48,0x14);
  local_48 = 0x34800000000;
  uStack_40 = 0x39c00000080;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"h264:dblk_disable",&local_48,0x14);
  local_48 = 0x34800000000;
  uStack_40 = 0x3a000000080;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"h264:dblk_alpha",&local_48,0x14);
  local_48 = 0x34800000000;
  uStack_40 = 0x3a400000080;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"h264:dblk_beta",&local_48,0x14);
  local_48 = 0x9000000000;
  uStack_40 = 0x10c00010000;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"h264:qp_init",&local_48,0x14);
  local_48 = 0x9000000000;
  uStack_40 = 0x11800020000;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"h264:qp_min",&local_48,0x14);
  local_48 = 0x9000000000;
  uStack_40 = 0x11000020000;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"h264:qp_max",&local_48,0x14);
  local_48 = 0x9000000000;
  uStack_40 = 0x11c00040000;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"h264:qp_min_i",&local_48,0x14);
  local_48 = 0x9000000000;
  uStack_40 = 0x11400040000;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"h264:qp_max_i",&local_48,0x14);
  local_48 = 0x9000000000;
  uStack_40 = 0x12000080000;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"h264:qp_step",&local_48,0x14);
  local_48 = 0x9000000000;
  uStack_40 = 0x12400100000;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"h264:qp_delta_ip",&local_48,0x14);
  local_48 = 0x34800000000;
  uStack_40 = 0x3c800400000;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"h264:max_tid",&local_48,0x14);
  local_48 = 0x34800000000;
  uStack_40 = 0x3c400200000;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"h264:max_ltr",&local_48,0x14);
  local_48 = 0x34800000000;
  uStack_40 = 0x3cc00800000;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"h264:prefix_mode",&local_48,0x14);
  local_48 = 0x34800000000;
  uStack_40 = 0x3d001000000;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"h264:base_layer_pid",&local_48,0x14);
  local_48 = 0x34800000001;
  uStack_40 = 0x3d420000000;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"h264:constraint_set",&local_48,0x14);
  local_48 = 0x34800000000;
  uStack_40 = 0x34c00000001;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"h265:profile",&local_48,0x14);
  local_48 = 0x34800000000;
  uStack_40 = 0x35400000001;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"h265:tier",&local_48,0x14);
  local_48 = 0x34800000000;
  uStack_40 = 0x35000000001;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"h265:level",&local_48,0x14);
  local_48 = 0x34800000001;
  uStack_40 = 0x41c00004000;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"h265:scaling_list",&local_48,0x14);
  local_48 = 0x34800000000;
  uStack_40 = 0x42000004000;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"h265:cb_qp_offset",&local_48,0x14);
  local_48 = 0x34800000000;
  uStack_40 = 0x42400004000;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"h265:cr_qp_offset",&local_48,0x14);
  local_48 = 0x34800000000;
  uStack_40 = 0x42800004000;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"h265:diff_cu_qp_delta_depth",&local_48,0x14);
  local_48 = 0x34800000001;
  uStack_40 = 0x43800001000;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"h265:dblk_disable",&local_48,0x14);
  local_48 = 0x34800000000;
  uStack_40 = 0x43c00001000;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"h265:dblk_alpha",&local_48,0x14);
  local_48 = 0x34800000000;
  uStack_40 = 0x44000001000;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"h265:dblk_beta",&local_48,0x14);
  local_48 = 0x9000000000;
  uStack_40 = 0x10c00010000;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"h265:qp_init",&local_48,0x14);
  local_48 = 0x9000000000;
  uStack_40 = 0x11800020000;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"h265:qp_min",&local_48,0x14);
  local_48 = 0x9000000000;
  uStack_40 = 0x11000020000;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"h265:qp_max",&local_48,0x14);
  local_48 = 0x9000000000;
  uStack_40 = 0x11c00040000;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"h265:qp_min_i",&local_48,0x14);
  local_48 = 0x9000000000;
  uStack_40 = 0x11400040000;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"h265:qp_max_i",&local_48,0x14);
  local_48 = 0x9000000000;
  uStack_40 = 0x12000080000;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"h265:qp_step",&local_48,0x14);
  local_48 = 0x9000000000;
  uStack_40 = 0x12400100000;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"h265:qp_delta_ip",&local_48,0x14);
  local_48 = 0x34800000000;
  uStack_40 = 0x42c00002000;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"h265:sao_luma_disable",&local_48,0x14);
  local_48 = 0x34800000000;
  uStack_40 = 0x43000002000;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"h265:sao_chroma_disable",&local_48,0x14);
  local_48 = 0x34800000000;
  uStack_40 = 0x43400002000;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"h265:sao_bit_ratio",&local_48,0x14);
  local_48 = 0x34800000001;
  uStack_40 = 0x45800800000;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"h265:lpf_acs_sli_en",&local_48,0x14);
  local_48 = 0x34800000001;
  uStack_40 = 0x45c01000000;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"h265:lpf_acs_tile_disable",&local_48,0x14);
  local_48 = 0x34800000000;
  uStack_40 = 0x45400400000;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"h265:auto_tile",&local_48,0x14);
  local_48 = 0x34800000000;
  uStack_40 = 0x3c808000000;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"h265:max_tid",&local_48,0x14);
  local_48 = 0x34800000000;
  uStack_40 = 0x3c410000000;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"h265:max_ltr",&local_48,0x14);
  local_48 = 0x34800000000;
  uStack_40 = 0x3cc20000000;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"h265:base_layer_pid",&local_48,0x14);
  local_48 = 0x34800000000;
  uStack_40 = 0x35802000000;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"h265:const_intra",&local_48,0x14);
  local_48 = 0x34800000000;
  uStack_40 = 0x36004000000;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"h265:lcu_size",&local_48,0x14);
  local_48 = 0x9000000000;
  uStack_40 = 0x10c00010000;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"vp8:qp_init",&local_48,0x14);
  local_48 = 0x9000000000;
  uStack_40 = 0x11800020000;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"vp8:qp_min",&local_48,0x14);
  local_48 = 0x9000000000;
  uStack_40 = 0x11000020000;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"vp8:qp_max",&local_48,0x14);
  local_48 = 0x9000000000;
  uStack_40 = 0x11c00040000;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"vp8:qp_min_i",&local_48,0x14);
  local_48 = 0x9000000000;
  uStack_40 = 0x11400040000;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"vp8:qp_max_i",&local_48,0x14);
  local_48 = 0x9000000000;
  uStack_40 = 0x12000080000;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"vp8:qp_step",&local_48,0x14);
  local_48 = 0x9000000000;
  uStack_40 = 0x12400100000;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"vp8:qp_delta_ip",&local_48,0x14);
  local_48 = 0x34800000000;
  uStack_40 = 0x36800000002;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"vp8:disable_ivf",&local_48,0x14);
  local_48 = 0x34800000000;
  uStack_40 = 0x34c00000001;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"jpeg:quant",&local_48,0x14);
  local_48 = 0x34800000005;
  uStack_40 = 0x36000000002;
  local_38 = 8;
  mpp_trie_add_info(this->mTrie,"jpeg:qtable_y",&local_48,0x14);
  local_48 = 0x34800000005;
  uStack_40 = 0x36800000002;
  local_38 = 8;
  mpp_trie_add_info(this->mTrie,"jpeg:qtable_u",&local_48,0x14);
  local_48 = 0x34800000005;
  uStack_40 = 0x37000000002;
  local_38 = 8;
  mpp_trie_add_info(this->mTrie,"jpeg:qtable_v",&local_48,0x14);
  local_48 = 0x34800000000;
  uStack_40 = 0x35000000004;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"jpeg:q_factor",&local_48,0x14);
  local_48 = 0x34800000000;
  uStack_40 = 0x35400000004;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"jpeg:qf_max",&local_48,0x14);
  local_48 = 0x34800000000;
  uStack_40 = 0x35800000004;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"jpeg:qf_min",&local_48,0x14);
  local_48 = 0xe9000000001;
  uStack_40 = 0xe9400000001;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"split:mode",&local_48,0x14);
  local_48 = 0xe9000000001;
  uStack_40 = 0xe9800000002;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"split:arg",&local_48,0x14);
  local_48 = 0xe9000000001;
  uStack_40 = 0xe9c00000004;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"split:out",&local_48,0x14);
  local_48 = 0x17800000000;
  uStack_40 = 0x17c00000001;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"hw:qp_row",&local_48,0x14);
  local_48 = 0x17800000000;
  uStack_40 = 0x18000000002;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"hw:qp_row_i",&local_48,0x14);
  local_48 = 0x17800000004;
  uStack_40 = 0x19800000004;
  local_38 = 0x40;
  mpp_trie_add_info(this->mTrie,"hw:aq_thrd_i",&local_48,0x14);
  local_48 = 0x17800000004;
  uStack_40 = 0x1d800000008;
  local_38 = 0x40;
  mpp_trie_add_info(this->mTrie,"hw:aq_thrd_p",&local_48,0x14);
  local_48 = 0x17800000004;
  uStack_40 = 0x21800000010;
  local_38 = 0x40;
  mpp_trie_add_info(this->mTrie,"hw:aq_step_i",&local_48,0x14);
  local_48 = 0x17800000004;
  uStack_40 = 0x25800000020;
  local_38 = 0x40;
  mpp_trie_add_info(this->mTrie,"hw:aq_step_p",&local_48,0x14);
  local_48 = 0x17800000000;
  uStack_40 = 0x29800000040;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"hw:mb_rc_disable",&local_48,0x14);
  local_48 = 0x17800000004;
  uStack_40 = 0x31400002000;
  local_38 = 0x28;
  mpp_trie_add_info(this->mTrie,"hw:aq_rnge_arr",&local_48,0x14);
  local_48 = 0x17800000004;
  uStack_40 = 0x2a000000100;
  local_38 = 0x20;
  mpp_trie_add_info(this->mTrie,"hw:mode_bias",&local_48,0x14);
  local_48 = 0x17800000000;
  uStack_40 = 0x2c000000200;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"hw:skip_bias_en",&local_48,0x14);
  local_48 = 0x17800000000;
  uStack_40 = 0x2c400000200;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"hw:skip_sad",&local_48,0x14);
  local_48 = 0x17800000000;
  uStack_40 = 0x2c800000200;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"hw:skip_bias",&local_48,0x14);
  local_48 = 0x17800000000;
  uStack_40 = 0x18400000400;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"hw:qbias_i",&local_48,0x14);
  local_48 = 0x17800000000;
  uStack_40 = 0x18800000800;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"hw:qbias_p",&local_48,0x14);
  local_48 = 0x17800000000;
  uStack_40 = 0x18c00001000;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"hw:qbias_en",&local_48,0x14);
  local_48 = 0x17800000004;
  uStack_40 = 0x2cc00004000;
  local_38 = 0x48;
  mpp_trie_add_info(this->mTrie,"hw:qbias_arr",&local_48,0x14);
  local_48 = 0x17800000000;
  uStack_40 = 0x19000008000;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"hw:flt_str_i",&local_48,0x14);
  local_48 = 0x17800000000;
  uStack_40 = 0x19400010000;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"hw:flt_str_p",&local_48,0x14);
  local_48 = 0x186000000000;
  uStack_40 = 0x186400000001;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"tune:scene_mode",&local_48,0x14);
  local_48 = 0x186000000000;
  uStack_40 = 0x186800000002;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"tune:deblur_en",&local_48,0x14);
  local_48 = 0x186000000000;
  uStack_40 = 0x186c00000004;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"tune:deblur_str",&local_48,0x14);
  local_48 = 0x186000000000;
  uStack_40 = 0x187000000008;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"tune:anti_flicker_str",&local_48,0x14);
  local_48 = 0x186000000000;
  uStack_40 = 0x187400000020;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"tune:lambda_idx_i",&local_48,0x14);
  local_48 = 0x186000000000;
  uStack_40 = 0x187800000040;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"tune:lambda_idx_p",&local_48,0x14);
  local_48 = 0x186000000000;
  uStack_40 = 0x187c00000080;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"tune:atr_str_i",&local_48,0x14);
  local_48 = 0x186000000000;
  uStack_40 = 0x188000000100;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"tune:atr_str_p",&local_48,0x14);
  local_48 = 0x186000000000;
  uStack_40 = 0x188400000200;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"tune:atl_str",&local_48,0x14);
  local_48 = 0x186000000000;
  uStack_40 = 0x188800000400;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"tune:sao_str_i",&local_48,0x14);
  local_48 = 0x186000000000;
  uStack_40 = 0x188c00000800;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"tune:sao_str_p",&local_48,0x14);
  local_48 = 0x186000000000;
  uStack_40 = 0x189000002000;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"tune:rc_container",&local_48,0x14);
  local_48 = 0x186000000000;
  uStack_40 = 0x189400004000;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"tune:vmaf_opt",&local_48,0x14);
  local_48 = 0x186000000000;
  uStack_40 = 0x189800008000;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"tune:motion_static_switch_enable",&local_48,0x14);
  local_48 = 0x186000000000;
  uStack_40 = 0x189c00010000;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"tune:atf_str",&local_48,0x14);
  local_48 = 0x186000000000;
  uStack_40 = 0x18a000020000;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"tune:lgt_chg_lvl",&local_48,0x14);
  local_48 = 0x186000000000;
  uStack_40 = 0x18a400040000;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"tune:static_frm_num",&local_48,0x14);
  local_48 = 0x186000000000;
  uStack_40 = 0x18a800080000;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"tune:madp16_th",&local_48,0x14);
  local_48 = 0x186000000000;
  uStack_40 = 0x18ac00100000;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"tune:skip16_wgt",&local_48,0x14);
  local_48 = 0x186000000000;
  uStack_40 = 0x18b000200000;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"tune:skip32_wgt",&local_48,0x14);
  local_48 = 0x186000000000;
  uStack_40 = 0x18b800400000;
  local_38 = 4;
  mpp_trie_add_info(this->mTrie,"tune:speed",&local_48,0x14);
  mpp_trie_add_info(this->mTrie,(char *)0x0,(void *)0x0,0);
  RVar2 = mpp_trie_get_node_count(this->mTrie);
  (this->mHead).node_count = RVar2;
  RVar2 = mpp_trie_get_info_count(this->mTrie);
  (this->mHead).info_count = RVar2;
  RVar2 = mpp_trie_get_buf_size(this->mTrie);
  (this->mHead).info_size = RVar2;
  if (((byte)mpp_enc_cfg_debug & 1) != 0) {
    _mpp_log_l(4,"mpp_enc_cfg","node cnt: %d\n","MppEncCfgService",
               (ulong)(uint)(this->mHead).node_count);
  }
  return;
}

Assistant:

MppEncCfgService::MppEncCfgService() :
    mTrie(NULL)
{
    MPP_RET ret;

    mpp_env_get_u32("mpp_enc_cfg_debug", &mpp_enc_cfg_debug, 0);

    ret = mpp_trie_init(&mTrie, "MppEncCfg");
    if (ret) {
        mpp_err_f("failed to init enc cfg set trie ret %d\n", ret);
        return ;
    }

    ENTRY_TABLE(EXPAND_AS_TRIE)

    mpp_trie_add_info(mTrie, NULL, NULL, 0);

    mHead.node_count = mpp_trie_get_node_count(mTrie);
    mHead.info_count = mpp_trie_get_info_count(mTrie);
    mHead.info_size = mpp_trie_get_buf_size(mTrie);

    mpp_enc_cfg_dbg_func("node cnt: %d\n", mHead.node_count);
}